

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void drawnumber_key(void *z,t_symbol *keysym,t_floatarg fkey)

{
  _instancetemplate *p_Var1;
  t_scalar *ptVar2;
  _glist *owner;
  t_template *template;
  _array *a;
  int iVar3;
  t_symbol *ptVar4;
  size_t sVar5;
  char *fmt;
  t_float tVar6;
  double newf;
  t_atom at;
  char sbuf [1000];
  double local_430;
  t_atom local_428;
  char local_418 [999];
  undefined1 local_31;
  
  iVar3 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),0);
  if (iVar3 == 0) {
    fmt = "drawnumber_motion: scalar disappeared";
LAB_0015d2f9:
    post(fmt);
    return;
  }
  iVar3 = (int)fkey;
  if (iVar3 == 0) {
    return;
  }
  p_Var1 = (pd_maininstance.pd_gui)->i_template;
  if (*(int *)(p_Var1 + 0x108) != 0) {
    if (*(int *)(p_Var1 + 0x108) == 1) {
      if (*(int *)(p_Var1 + 0x10c) == 0) {
        ptVar4 = template_getsymbol(*(t_template **)(p_Var1 + 0xe8),*(t_symbol **)((long)z + 0x30),
                                    *(t_word **)(p_Var1 + 0xe0),1);
        strncpy(local_418,ptVar4->s_name,1000);
      }
      else {
        local_418[0] = '\0';
      }
      local_31 = 0;
      if (iVar3 == 8) {
        if (local_418[0] == '\0') {
          return;
        }
        sVar5 = strlen(local_418);
        local_418[sVar5 - 1] = '\0';
        return;
      }
      sVar5 = strlen(local_418);
      local_418[sVar5 + 1] = '\0';
      sVar5 = strlen(local_418);
      local_418[sVar5] = (char)iVar3;
      return;
    }
    fmt = "typing at text fields not yet implemented";
    goto LAB_0015d2f9;
  }
  if (*(int *)(p_Var1 + 0x10c) == 0) {
    tVar6 = template_getfloat(*(t_template **)(p_Var1 + 0xe8),*(t_symbol **)((long)z + 0x30),
                              *(t_word **)(p_Var1 + 0xe0),1);
    sprintf(local_418,"%g",(double)tVar6);
  }
  else {
    local_418[0] = '\0';
  }
  *(uint *)((pd_maininstance.pd_gui)->i_template + 0x10c) = (uint)(iVar3 == 10);
  if (iVar3 == 8) {
    if (local_418[0] == '\0') goto LAB_0015d417;
    sVar5 = strlen(local_418);
    sVar5 = sVar5 - 1;
    iVar3 = 0;
  }
  else {
    sVar5 = strlen(local_418);
    local_418[sVar5 + 1] = '\0';
    sVar5 = strlen(local_418);
  }
  local_418[sVar5] = (char)iVar3;
LAB_0015d417:
  iVar3 = __isoc99_sscanf(local_418,"%lg",&local_430);
  if (iVar3 < 1) {
    local_430 = 0.0;
  }
  template_setfloat(*(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8),
                    *(t_symbol **)((long)z + 0x30),
                    *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0),(float)local_430,1);
  p_Var1 = (pd_maininstance.pd_gui)->i_template;
  ptVar2 = *(t_scalar **)(p_Var1 + 0xd0);
  if (ptVar2 != (t_scalar *)0x0) {
    owner = *(_glist **)(p_Var1 + 200);
    template = *(t_template **)(p_Var1 + 0xe8);
    ptVar4 = gensym("change");
    template_notifyforscalar(template,owner,ptVar2,ptVar4,1,&local_428);
  }
  ptVar2 = *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0);
  if (ptVar2 != (t_scalar *)0x0) {
    scalar_redraw(ptVar2,*(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
  }
  a = *(_array **)((pd_maininstance.pd_gui)->i_template + 0xd8);
  if (a != (_array *)0x0) {
    array_redraw(a,*(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
  }
  return;
}

Assistant:

static void drawnumber_key(void *z, t_symbol *keysym, t_floatarg fkey)
{
    t_drawnumber *x = (t_drawnumber *)z;
    int key = fkey;
    char sbuf[MAXPDSTRING];
    t_atom at;
    if (!gpointer_check(&TEMPLATE->drawnumber_motion_gpointer, 0))
    {
        post("drawnumber_motion: scalar disappeared");
        return;
    }
    if (key == 0)
        return;
    if (TEMPLATE->drawnumber_motion_type == DT_SYMBOL)
    {
            /* key entry for a symbol field */
        if (TEMPLATE->drawnumber_motion_firstkey)
            sbuf[0] = 0;
        else strncpy(sbuf,
            template_getsymbol(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, 1)->s_name,
                MAXPDSTRING);
        sbuf[MAXPDSTRING-1] = 0;
        if (key == '\b')
        {
            if (*sbuf)
                sbuf[strlen(sbuf)-1] = 0;
        }
        else
        {
            sbuf[strlen(sbuf)+1] = 0;
            sbuf[strlen(sbuf)] = key;
        }
    }
    else if (TEMPLATE->drawnumber_motion_type == DT_FLOAT)
    {
            /* key entry for a numeric field.  This is just a stopgap. */
        double newf;
        if (TEMPLATE->drawnumber_motion_firstkey)
            sbuf[0] = 0;
        else sprintf(sbuf, "%g",
            template_getfloat(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, 1));
        TEMPLATE->drawnumber_motion_firstkey = (key == '\n');
        if (key == '\b')
        {
            if (*sbuf)
                sbuf[strlen(sbuf)-1] = 0;
        }
        else
        {
            sbuf[strlen(sbuf)+1] = 0;
            sbuf[strlen(sbuf)] = key;
        }
        if (sscanf(sbuf, "%lg", &newf) < 1)
            newf = 0;
        template_setfloat(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, (t_float)newf, 1);
        if (TEMPLATE->drawnumber_motion_scalar)
            template_notifyforscalar(TEMPLATE->drawnumber_motion_template,
                TEMPLATE->drawnumber_motion_glist,
                    TEMPLATE->drawnumber_motion_scalar,
                    gensym("change"), 1, &at);
        if (TEMPLATE->drawnumber_motion_scalar)
            scalar_redraw(TEMPLATE->drawnumber_motion_scalar,
                TEMPLATE->drawnumber_motion_glist);
        if (TEMPLATE->drawnumber_motion_array)
            array_redraw(TEMPLATE->drawnumber_motion_array,
                TEMPLATE->drawnumber_motion_glist);
    }
    else post("typing at text fields not yet implemented");
}